

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void __thiscall RTVector3::accelToEuler(RTVector3 *this,RTVector3 *rollPitchYaw)

{
  undefined8 uVar1;
  RTFLOAT RVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  RTFLOAT RVar5;
  RTFLOAT RVar6;
  undefined4 extraout_XMM0_Db;
  double dVar7;
  undefined1 local_24 [8];
  RTVector3 normAccel;
  RTVector3 *rollPitchYaw_local;
  RTVector3 *this_local;
  
  local_24 = *(undefined1 (*) [8])this->m_data;
  normAccel.m_data[0] = this->m_data[2];
  normAccel.m_data._4_8_ = rollPitchYaw;
  normalize((RTVector3 *)local_24);
  uVar1 = normAccel.m_data._4_8_;
  RVar2 = y((RTVector3 *)local_24);
  RVar3 = z((RTVector3 *)local_24);
  dVar7 = std::atan2((double)(ulong)(uint)RVar2,(double)CONCAT44(extraout_XMM0_Db,RVar3));
  setX((RTVector3 *)uVar1,SUB84(dVar7,0));
  uVar1 = normAccel.m_data._4_8_;
  RVar2 = x((RTVector3 *)local_24);
  RVar3 = y((RTVector3 *)local_24);
  RVar4 = y((RTVector3 *)local_24);
  RVar5 = z((RTVector3 *)local_24);
  RVar6 = z((RTVector3 *)local_24);
  dVar7 = std::sqrt((double)(ulong)(uint)(RVar3 * RVar4 + RVar5 * RVar6));
  dVar7 = std::atan2((double)(ulong)(uint)RVar2,dVar7);
  setY((RTVector3 *)uVar1,-SUB84(dVar7,0));
  setZ((RTVector3 *)normAccel.m_data._4_8_,0.0);
  return;
}

Assistant:

void RTVector3::accelToEuler(RTVector3& rollPitchYaw) const
{
    RTVector3 normAccel = *this;

    normAccel.normalize();

    rollPitchYaw.setX(atan2(normAccel.y(), normAccel.z()));
    rollPitchYaw.setY(-atan2(normAccel.x(), sqrt(normAccel.y() * normAccel.y() + normAccel.z() * normAccel.z())));
    rollPitchYaw.setZ(0);
}